

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

bool __thiscall
deqp::gls::FboUtil::FormatDB::ExtensionInfo::operator<(ExtensionInfo *this,ExtensionInfo *other)

{
  _Rb_tree_header *__last1;
  bool bVar1;
  bool bVar2;
  
  __last1 = &(this->requiredExtensions)._M_t._M_impl.super__Rb_tree_header;
  bVar1 = std::
          __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((this->requiredExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                     ,__last1,(other->requiredExtensions)._M_t._M_impl.super__Rb_tree_header.
                              _M_header._M_left,
                     &(other->requiredExtensions)._M_t._M_impl.super__Rb_tree_header);
  bVar2 = true;
  if (!bVar1) {
    if (((this->requiredExtensions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
         (other->requiredExtensions)._M_t._M_impl.super__Rb_tree_header._M_node_count) &&
       (bVar1 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                          ((this->requiredExtensions)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )__last1,
                           (other->requiredExtensions)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left), bVar1)) {
      return (int)this->flags < (int)other->flags;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FormatDB::ExtensionInfo::operator< (const ExtensionInfo& other) const
{
	return (requiredExtensions < other.requiredExtensions) ||
		   ((requiredExtensions == other.requiredExtensions) && (flags < other.flags));
}